

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-test.h
# Opt level: O2

ParamGenerator<(anonymous_namespace)::QuantParam>
testing::ValuesIn<(anonymous_namespace)::QuantParam,5ul>
          (anon_struct_8_2_dd000bf7_for__M_head_impl (*array) [5])

{
  anon_struct_8_2_dd000bf7_for__M_head_impl aVar1;
  void *pvVar2;
  anon_struct_8_2_dd000bf7_for__M_head_impl aVar3;
  long lVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ParamGenerator<(anonymous_namespace)::QuantParam> PVar5;
  
  aVar1 = (anon_struct_8_2_dd000bf7_for__M_head_impl)operator_new(0x20);
  *(undefined ***)aVar1 = &PTR__ValuesInIteratorRangeGenerator_00f00c10;
  *(undefined8 *)((long)aVar1 + 8) = 0;
  *(undefined8 *)((long)aVar1 + 0x10) = 0;
  *(undefined8 *)((long)aVar1 + 0x18) = 0;
  pvVar2 = operator_new(0x28);
  *(void **)((long)aVar1 + 8) = pvVar2;
  *(long *)((long)aVar1 + 0x18) = (long)pvVar2 + 0x28;
  for (lVar4 = 0; lVar4 != 0x28; lVar4 = lVar4 + 8) {
    *(undefined8 *)((long)pvVar2 + lVar4) =
         *(undefined8 *)((long)&::(anonymous_namespace)::QuantTestParams + lVar4);
  }
  *(long *)((long)aVar1 + 0x10) = (long)pvVar2 + 0x28;
  (*array)[0] = aVar1;
  ((anon_struct_8_2_dd000bf7_for__M_head_impl *)((long)array + 8))->min_q = 0;
  ((anon_struct_8_2_dd000bf7_for__M_head_impl *)((long)array + 8))->max_q = 0;
  aVar3 = (anon_struct_8_2_dd000bf7_for__M_head_impl)operator_new(0x18);
  *(undefined8 *)((long)aVar3 + 8) = 0x100000001;
  *(undefined ***)aVar3 = &PTR___Sp_counted_base_00f00cd8;
  *(anon_struct_8_2_dd000bf7_for__M_head_impl *)((long)aVar3 + 0x10) = aVar1;
  (*array)[1] = aVar3;
  PVar5.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::QuantParam>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  PVar5.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::QuantParam>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)array;
  return (ParamGenerator<(anonymous_namespace)::QuantParam>)
         PVar5.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::QuantParam>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

internal::ParamGenerator<T> ValuesIn(const T (&array)[N]) {
  return ValuesIn(array, array + N);
}